

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void TrimSpaces(TidyDocImpl *doc,Node *element)

{
  Node *pNVar1;
  Node *pNVar2;
  Lexer *pLVar3;
  Bool BVar4;
  uint uVar5;
  Lexer *lexer;
  
  pNVar1 = element->content;
  if ((element->tag == (Dict *)0x0) || (element->tag->id != TidyTag_PRE)) {
    for (pNVar2 = element->parent; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->parent) {
      if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->parser == prvTidyParsePre)) {
        return;
      }
    }
    BVar4 = prvTidynodeIsText(pNVar1);
    if (BVar4 != no) {
      TrimInitialSpace((TidyDocImpl *)doc->lexer,element,pNVar1);
    }
    pNVar1 = element->last;
    BVar4 = prvTidynodeIsText(pNVar1);
    if (BVar4 != no) {
      pLVar3 = doc->lexer;
      BVar4 = prvTidynodeIsText(pNVar1);
      if ((((BVar4 != no) && (pNVar1->start < pNVar1->end)) &&
          (uVar5 = pNVar1->end - 1, pLVar3->lexbuf[uVar5] == ' ')) &&
         (pNVar1->end = uVar5, (element->tag->model & 0x410) == 0x10)) {
        pLVar3->insertspace = yes;
      }
    }
  }
  return;
}

Assistant:

static void TrimSpaces( TidyDocImpl* doc, Node *element)
{
    Node* text = element->content;

    if (nodeIsPRE(element) || IsPreDescendant(element))
        return;

    if (TY_(nodeIsText)(text))
        TrimInitialSpace(doc, element, text);

    text = element->last;

    if (TY_(nodeIsText)(text))
        TrimTrailingSpace(doc, element, text);
}